

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O2

void BaseMap_Close(TFileStream *pStream)

{
  void *__addr;
  
  __addr = (pStream->Base).File.hFile;
  if (__addr != (void *)0x0) {
    munmap(__addr,(pStream->Base).File.FileSize);
  }
  (pStream->Base).File.hFile = (HANDLE)0x0;
  return;
}

Assistant:

static void BaseMap_Close(TFileStream * pStream)
{
#ifdef PLATFORM_WINDOWS
    if(pStream->Base.Map.pbFile != NULL)
        UnmapViewOfFile(pStream->Base.Map.pbFile);
#endif

#if defined(PLATFORM_MAC) || defined(PLATFORM_LINUX)
    if(pStream->Base.Map.pbFile != NULL)
        munmap(pStream->Base.Map.pbFile, (size_t )pStream->Base.Map.FileSize);
#endif

    pStream->Base.Map.pbFile = NULL;
}